

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O3

csafestring_t * safe_clone(csafestring_t *obj)

{
  size_t __size;
  csafestring_t *pcVar1;
  char *__dest;
  
  pcVar1 = (csafestring_t *)malloc(0x10);
  __size = obj->buffer_length;
  pcVar1->buffer_length = __size;
  __dest = (char *)malloc(__size);
  pcVar1->data = __dest;
  memcpy(__dest,obj->data,__size);
  return pcVar1;
}

Assistant:

csafestring_t *safe_clone(csafestring_t *obj) {
	csafestring_t *clone = (csafestring_t *) malloc(sizeof(csafestring_t));
	clone->buffer_length = obj->buffer_length;
	clone->data = malloc(clone->buffer_length);
	memcpy(clone->data, obj->data, clone->buffer_length);

#ifdef EXPERIMENTAL_SIZING
	clone->sizing_size = obj->sizing_size;
	sizing_size += clone->sizing_size;
	sizing_count++;
#endif
	
	return clone;
}